

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O2

ref<immutable::rrb_details::tree_node<char,_true>_> __thiscall
immutable::rrb_details::rrb_drop_left_rec<char,true,5>
          (rrb_details *this,uint32_t *total_shift,
          ref<immutable::rrb_details::tree_node<char,_true>_> *root,uint32_t left,uint32_t shift,
          bool has_right)

{
  char cVar1;
  uint32_t *puVar2;
  ref<immutable::rrb_details::internal_node<char,_true>_> *prVar3;
  internal_node<char,_true> *piVar4;
  leaf_node<char,_true> *plVar5;
  rrb_size_table<true> *prVar6;
  byte bVar7;
  uint32_t uVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  uint32_t i;
  ulong uVar14;
  ref<immutable::rrb_details::internal_node<char,_true>_> left_hand_parent;
  ref<immutable::rrb_details::internal_node<char,_true>_> internal_root;
  ref<immutable::rrb_details::rrb_size_table<true>_> sliced_table;
  ref<immutable::rrb_details::internal_node<char,_true>_> internal_left_hand_node;
  ref<immutable::rrb_details::tree_node<char,_true>_> child;
  ref<immutable::rrb_details::tree_node<char,_true>_> left_hand_node;
  
  bVar7 = (byte)shift;
  uVar13 = left >> (bVar7 & 0x1f);
  if (shift == 0) {
    internal_root.ptr = (internal_node<char,_true> *)root->ptr;
    if (internal_root.ptr != (internal_node<char,_true> *)0x0) {
      LOCK();
      ((internal_root.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i =
           ((internal_root.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
      UNLOCK();
    }
    plVar5 = ref<immutable::rrb_details::leaf_node<char,_true>_>::operator->
                       ((ref<immutable::rrb_details::leaf_node<char,_true>_> *)&internal_root);
    uVar9 = plVar5->len - uVar13;
    child.ptr = (tree_node<char,_true> *)leaf_node_create<char,true>(uVar9);
    if ((leaf_node<char,_true> *)child.ptr != (leaf_node<char,_true> *)0x0) {
      LOCK();
      (((leaf_node<char,_true> *)child.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i = 1;
      UNLOCK();
    }
    for (uVar12 = 0; uVar9 != uVar12; uVar12 = uVar12 + 1) {
      plVar5 = ref<immutable::rrb_details::leaf_node<char,_true>_>::operator->
                         ((ref<immutable::rrb_details::leaf_node<char,_true>_> *)&internal_root);
      cVar1 = plVar5->child[uVar13 + (int)uVar12];
      plVar5 = ref<immutable::rrb_details::leaf_node<char,_true>_>::operator->
                         ((ref<immutable::rrb_details::leaf_node<char,_true>_> *)&child);
      plVar5->child[uVar12] = cVar1;
    }
    *total_shift = 0;
    *(tree_node<char,_true> **)this = child.ptr;
    if (child.ptr != (tree_node<char,_true> *)0x0) {
      LOCK();
      ((child.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i =
           ((child.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
      UNLOCK();
    }
    release<char>((leaf_node<char,_true> *)child.ptr);
    release<char>((leaf_node<char,_true> *)internal_root.ptr);
    return (ref<immutable::rrb_details::tree_node<char,_true>_>)(tree_node<char,_true> *)this;
  }
  internal_root.ptr = (internal_node<char,_true> *)root->ptr;
  if (internal_root.ptr != (internal_node<char,_true> *)0x0) {
    LOCK();
    ((internal_root.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i =
         ((internal_root.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
    UNLOCK();
  }
  piVar4 = ref<immutable::rrb_details::internal_node<char,_true>_>::operator->(&internal_root);
  if ((piVar4->size_table).ptr == (rrb_size_table<true> *)0x0) {
    uVar8 = left - (uVar13 << (bVar7 & 0x1f));
  }
  else {
    piVar4 = ref<immutable::rrb_details::internal_node<char,_true>_>::operator->(&internal_root);
    puVar2 = ((piVar4->size_table).ptr)->size;
    uVar12 = (ulong)(uVar13 - 1);
    do {
      uVar14 = uVar12;
      uVar13 = (int)uVar14 + 1;
      uVar12 = (ulong)uVar13;
    } while (puVar2[uVar13] <= left);
    if (uVar13 == 0) {
      uVar13 = 0;
      uVar8 = left;
    }
    else {
      uVar8 = left - puVar2[uVar14];
    }
  }
  piVar4 = ref<immutable::rrb_details::internal_node<char,_true>_>::operator->(&internal_root);
  uVar9 = piVar4->len - 1;
  piVar4 = ref<immutable::rrb_details::internal_node<char,_true>_>::operator->(&internal_root);
  child.ptr = (tree_node<char,_true> *)piVar4->child[uVar13].ptr;
  if ((internal_node<char,_true> *)child.ptr != (internal_node<char,_true> *)0x0) {
    LOCK();
    (((internal_node<char,_true> *)child.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i =
         (((internal_node<char,_true> *)child.ptr)->_ref_count).super___atomic_base<unsigned_int>.
         _M_i + 1;
    UNLOCK();
  }
  rrb_drop_left_rec<char,true,5>
            ((rrb_details *)&left_hand_node,total_shift,&child,uVar8,shift - 5,
             uVar13 != uVar9 || has_right);
  if (uVar13 == uVar9) {
    if (!has_right) {
      *(tree_node<char,_true> **)this = left_hand_node.ptr;
      if (left_hand_node.ptr != (tree_node<char,_true> *)0x0) {
        LOCK();
        ((left_hand_node.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i =
             ((left_hand_node.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
        UNLOCK();
      }
      goto LAB_00136112;
    }
    left_hand_parent.ptr = internal_node_create<char,true>(1);
    if (left_hand_parent.ptr != (internal_node<char,_true> *)0x0) {
      LOCK();
      ((left_hand_parent.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i = 1;
      UNLOCK();
    }
    internal_left_hand_node.ptr = (internal_node<char,_true> *)left_hand_node.ptr;
    if (left_hand_node.ptr != (tree_node<char,_true> *)0x0) {
      LOCK();
      ((left_hand_node.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i =
           ((left_hand_node.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
      UNLOCK();
    }
    piVar4 = ref<immutable::rrb_details::internal_node<char,_true>_>::operator->(&left_hand_parent);
    ref<immutable::rrb_details::internal_node<char,_true>_>::operator=
              (piVar4->child,&internal_left_hand_node);
    if ((shift - 5 != 0) &&
       (piVar4 = ref<immutable::rrb_details::internal_node<char,_true>_>::operator->
                           (&internal_left_hand_node),
       (piVar4->size_table).ptr != (rrb_size_table<true> *)0x0)) {
      sliced_table.ptr = size_table_create<true>(1);
      if (sliced_table.ptr != (rrb_size_table<true> *)0x0) {
        LOCK();
        ((sliced_table.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i = 1;
        UNLOCK();
      }
      piVar4 = ref<immutable::rrb_details::internal_node<char,_true>_>::operator->
                         (&internal_left_hand_node);
      prVar6 = ref<immutable::rrb_details::rrb_size_table<true>_>::operator->(&piVar4->size_table);
      puVar2 = prVar6->size;
      piVar4 = ref<immutable::rrb_details::internal_node<char,_true>_>::operator->
                         (&internal_left_hand_node);
      uVar8 = puVar2[piVar4->len - 1];
      prVar6 = ref<immutable::rrb_details::rrb_size_table<true>_>::operator->(&sliced_table);
      *prVar6->size = uVar8;
      piVar4 = ref<immutable::rrb_details::internal_node<char,_true>_>::operator->
                         (&left_hand_parent);
      ref<immutable::rrb_details::rrb_size_table<true>_>::operator=
                (&piVar4->size_table,&sliced_table);
      release(sliced_table.ptr);
    }
    *total_shift = shift;
    *(internal_node<char,_true> **)this = left_hand_parent.ptr;
    if (left_hand_parent.ptr != (internal_node<char,_true> *)0x0) {
      LOCK();
      ((left_hand_parent.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i =
           ((left_hand_parent.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
      UNLOCK();
    }
    ref<immutable::rrb_details::internal_node<char,_true>_>::~ref(&internal_left_hand_node);
  }
  else {
    piVar4 = ref<immutable::rrb_details::internal_node<char,_true>_>::operator->(&internal_root);
    uVar9 = piVar4->len - uVar13;
    uVar12 = (ulong)uVar9;
    left_hand_parent.ptr = internal_node_create<char,true>(uVar9);
    if (left_hand_parent.ptr != (internal_node<char,_true> *)0x0) {
      LOCK();
      ((left_hand_parent.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i = 1;
      UNLOCK();
    }
    uVar11 = uVar13;
    for (lVar10 = 0; uVar11 = uVar11 + 1, (ulong)(uVar9 - 1) << 3 != lVar10; lVar10 = lVar10 + 8) {
      piVar4 = ref<immutable::rrb_details::internal_node<char,_true>_>::operator->(&internal_root);
      prVar3 = piVar4->child;
      piVar4 = ref<immutable::rrb_details::internal_node<char,_true>_>::operator->
                         (&left_hand_parent);
      ref<immutable::rrb_details::internal_node<char,_true>_>::operator=
                ((ref<immutable::rrb_details::internal_node<char,_true>_> *)
                 ((long)&piVar4->child[1].ptr + lVar10),prVar3 + uVar11);
    }
    piVar4 = ref<immutable::rrb_details::internal_node<char,_true>_>::operator->(&internal_root);
    piVar4 = (internal_node<char,_true> *)(piVar4->size_table).ptr;
    if (piVar4 != (internal_node<char,_true> *)0x0) {
      LOCK();
      (piVar4->_ref_count).super___atomic_base<unsigned_int>._M_i =
           (piVar4->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
      UNLOCK();
    }
    internal_left_hand_node.ptr = piVar4;
    sliced_table.ptr = size_table_create<true>(uVar9);
    if (sliced_table.ptr != (rrb_size_table<true> *)0x0) {
      LOCK();
      ((sliced_table.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i = 1;
      UNLOCK();
    }
    if (piVar4 == (internal_node<char,_true> *)0x0) {
      for (uVar14 = 0; uVar12 != uVar14; uVar14 = uVar14 + 1) {
        prVar6 = ref<immutable::rrb_details::rrb_size_table<true>_>::operator->(&sliced_table);
        prVar6->size[uVar14] = (int)uVar14 + uVar13 + 1 << (bVar7 & 0x1f);
      }
    }
    else {
      prVar6 = ref<immutable::rrb_details::rrb_size_table<true>_>::operator->(&sliced_table);
      puVar2 = prVar6->size;
      prVar6 = ref<immutable::rrb_details::rrb_size_table<true>_>::operator->
                         ((ref<immutable::rrb_details::rrb_size_table<true>_> *)
                          &internal_left_hand_node);
      memcpy(puVar2,prVar6->size + uVar13,uVar12 * 4);
    }
    for (uVar14 = 0; uVar12 != uVar14; uVar14 = uVar14 + 1) {
      prVar6 = ref<immutable::rrb_details::rrb_size_table<true>_>::operator->(&sliced_table);
      prVar6->size[uVar14] = prVar6->size[uVar14] - left;
    }
    piVar4 = ref<immutable::rrb_details::internal_node<char,_true>_>::operator->(&left_hand_parent);
    ref<immutable::rrb_details::rrb_size_table<true>_>::operator=(&piVar4->size_table,&sliced_table)
    ;
    piVar4 = ref<immutable::rrb_details::internal_node<char,_true>_>::operator->(&left_hand_parent);
    ref<immutable::rrb_details::internal_node<char,true>>::operator=
              ((ref<immutable::rrb_details::internal_node<char,true>> *)piVar4->child,
               &left_hand_node);
    *total_shift = shift;
    *(internal_node<char,_true> **)this = left_hand_parent.ptr;
    if (left_hand_parent.ptr != (internal_node<char,_true> *)0x0) {
      LOCK();
      ((left_hand_parent.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i =
           ((left_hand_parent.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
      UNLOCK();
    }
    release(sliced_table.ptr);
    release((rrb_size_table<true> *)internal_left_hand_node.ptr);
  }
  ref<immutable::rrb_details::internal_node<char,_true>_>::~ref(&left_hand_parent);
LAB_00136112:
  ref<immutable::rrb_details::tree_node<char,_true>_>::~ref(&left_hand_node);
  ref<immutable::rrb_details::tree_node<char,_true>_>::~ref(&child);
  ref<immutable::rrb_details::internal_node<char,_true>_>::~ref(&internal_root);
  return (ref<immutable::rrb_details::tree_node<char,_true>_>)(tree_node<char,_true> *)this;
}

Assistant:

inline ref<tree_node<T, atomic_ref_counting>> rrb_drop_left_rec(uint32_t *total_shift, const ref<tree_node<T, atomic_ref_counting>>& root, uint32_t left, uint32_t shift, bool has_right)
      {
      const uint32_t subshift = shift - bits<N>::rrb_bits;
      uint32_t subidx = left >> shift;
      if (shift > 0)
        {
        ref<internal_node<T, atomic_ref_counting>> internal_root = root;
        uint32_t idx = left;
        if (internal_root->size_table.ptr == nullptr)
          {
          idx -= subidx << shift;
          }
        else
          { // if (internal_root->size_table != NULL)
          const rrb_size_table<atomic_ref_counting> *table = internal_root->size_table.ptr;

          while (table->size[subidx] <= idx)
            {
            subidx++;
            }
          if (subidx != 0)
            {
            idx -= table->size[subidx - 1];
            }
          }

        const uint32_t last_slot = internal_root->len - 1;
        ref<tree_node<T, atomic_ref_counting>> child = internal_root->child[subidx];
        ref<tree_node<T, atomic_ref_counting>> left_hand_node = rrb_drop_left_rec<T, atomic_ref_counting, N>(total_shift, child, idx, subshift, (subidx != last_slot) | has_right);
        if (subidx == last_slot)
          { // No more slots left
          if (has_right)
            {
            ref<internal_node<T, atomic_ref_counting>> left_hand_parent = internal_node_create<T, atomic_ref_counting>(1);
            ref<internal_node<T, atomic_ref_counting>> internal_left_hand_node = left_hand_node;
            left_hand_parent->child[0] = internal_left_hand_node;

            if (subshift != 0 && internal_left_hand_node->size_table.ptr != nullptr)
              {
              ref<rrb_size_table<atomic_ref_counting>> sliced_table = size_table_create<atomic_ref_counting>(1);
              sliced_table->size[0] = internal_left_hand_node->size_table->size[internal_left_hand_node->len - 1];
              left_hand_parent->size_table = sliced_table;
              }
            *total_shift = shift;
            return left_hand_parent;
            }
          else
            { // if (!has_right)
            return left_hand_node;
            }
          }
        else
          { // if (subidx != last_slot)

          const uint32_t sliced_len = internal_root->len - subidx;
          ref<internal_node<T, atomic_ref_counting>> sliced_root = internal_node_create<T, atomic_ref_counting>(sliced_len);

          // TODO: Can shrink size here if sliced_len == 2, using the ambidextrous
          // vector technique w. offset. Takes constant time.

          for (uint32_t i = 0; i < (sliced_len - 1); ++i)
            sliced_root->child[1 + i] = internal_root->child[subidx + 1 + i];

          ref<rrb_size_table<atomic_ref_counting>> table = internal_root->size_table; // [JanM] copy seems unnecessary, todo

          // TODO: Can check if left is a power of the tree size. If so, all nodes
          // will be completely populated, and we can ignore the size table. Most
          // importantly, this will remove the need to alloc a size table, which
          // increases perf.
          ref<rrb_size_table<atomic_ref_counting>> sliced_table = size_table_create<atomic_ref_counting>(sliced_len);

          if (table.ptr == nullptr)
            {
            for (uint32_t i = 0; i < sliced_len; i++)
              {
              // left is total amount sliced off. By adding in subidx, we get faster
              // computation later on.
              sliced_table->size[i] = (subidx + 1 + i) << shift;
              // NOTE: This doesn't really work properly for top root, as last node
              // may have a higher count than it *actually* has. To remedy for this,
              // the top function performs a check afterwards, which may insert the
              // correct value if there's a size table in the root.
              }
            }
          else
            { // if (table != NULL)
            memcpy(sliced_table->size, &table->size[subidx], sliced_len * sizeof(uint32_t));
            }

          for (uint32_t i = 0; i < sliced_len; i++)
            {
            sliced_table->size[i] -= left;
            }

          sliced_root->size_table = sliced_table;
          sliced_root->child[0] = left_hand_node;
          *total_shift = shift;
          return sliced_root;
          }
        }
      else
        { // if (shift <= RRB_BRANCHING)
        ref<leaf_node<T, atomic_ref_counting>> leaf_root = root;
        const uint32_t right_vals_len = leaf_root->len - subidx;
        ref<leaf_node<T, atomic_ref_counting>> right_vals = leaf_node_create<T, atomic_ref_counting>(right_vals_len);

        //memcpy(right_vals->child, &leaf_root->child[subidx], right_vals_len * sizeof(T));
        for (uint32_t i = 0; i < right_vals_len; ++i)
          right_vals->child[i] = leaf_root->child[subidx + i]; // don't memcpy, but use copy constructor

        *total_shift = shift;

        return right_vals;
        }
      }